

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

ps_decoder_t * ps_init(ps_config_t *config)

{
  int iVar1;
  ps_decoder_t *ps;
  
  ps = (ps_decoder_t *)
       __ckd_calloc__(1,0xa8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                      ,0x1b0);
  ps->refcount = 1;
  if (config != (ps_config_t *)0x0) {
    iVar1 = ps_reinit(ps,config);
    if (iVar1 < 0) {
      ps_free(ps);
      ps = (ps_decoder_t *)0x0;
    }
  }
  return ps;
}

Assistant:

ps_decoder_t *
ps_init(ps_config_t *config)
{
    ps_decoder_t *ps;
    
    ps = ckd_calloc(1, sizeof(*ps));
    ps->refcount = 1;
    if (config) {
        if (ps_reinit(ps, config) < 0) {
            ps_free(ps);
            return NULL;
        }
    }
    return ps;
}